

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmSystemTools.cxx
# Opt level: O3

size_type cmSystemToolsFindRPath(string_view *have,string_view *want)

{
  size_type sVar1;
  size_type __pos;
  ulong uVar2;
  ulong uVar3;
  
  if (have->_M_len == 0) {
    return 0xffffffffffffffff;
  }
  __pos = 0;
  do {
    sVar1 = std::basic_string_view<char,_std::char_traits<char>_>::find
                      (have,want->_M_str,__pos,want->_M_len);
    if (sVar1 == 0) {
LAB_002728c4:
      uVar3 = want->_M_len + sVar1;
      uVar2 = have->_M_len;
      if (uVar2 <= uVar3) {
        return sVar1;
      }
      if (have->_M_str[uVar3] == ':') {
        return sVar1;
      }
    }
    else {
      if (sVar1 == 0xffffffffffffffff) {
        return 0xffffffffffffffff;
      }
      if (have->_M_str[sVar1 - 1] == ':') goto LAB_002728c4;
      uVar2 = have->_M_len;
    }
    __pos = sVar1 + 1;
    if (uVar2 <= __pos) {
      return 0xffffffffffffffff;
    }
  } while( true );
}

Assistant:

static std::string::size_type cmSystemToolsFindRPath(
  cm::string_view const& have, cm::string_view const& want)
{
  std::string::size_type pos = 0;
  while (pos < have.size()) {
    // Look for an occurrence of the string.
    std::string::size_type const beg = have.find(want, pos);
    if (beg == std::string::npos) {
      return std::string::npos;
    }

    // Make sure it is separated from preceding entries.
    if (beg > 0 && have[beg - 1] != ':') {
      pos = beg + 1;
      continue;
    }

    // Make sure it is separated from following entries.
    std::string::size_type const end = beg + want.size();
    if (end < have.size() && have[end] != ':') {
      pos = beg + 1;
      continue;
    }

    // Return the position of the path portion.
    return beg;
  }

  // The desired rpath was not found.
  return std::string::npos;
}